

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_div_2(mp_int *a,mp_int *b)

{
  mp_digit *pmVar1;
  mp_digit *pmVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((b->alloc < a->used) && (iVar4 = mp_grow(b,a->used), iVar4 != 0)) {
    return iVar4;
  }
  iVar4 = b->used;
  uVar8 = a->used;
  uVar9 = (ulong)(int)uVar8;
  b->used = uVar8;
  pmVar1 = b->dp;
  if (0 < (long)uVar9) {
    pmVar2 = a->dp;
    iVar6 = uVar8 + 1;
    uVar7 = 0;
    uVar5 = uVar9;
    do {
      uVar5 = uVar5 - 1;
      uVar3 = pmVar2[uVar5];
      pmVar1[uVar5] = uVar7 << 0x3b | uVar3 >> 1;
      iVar6 = iVar6 + -1;
      uVar7 = (ulong)((uint)uVar3 & 1);
    } while (1 < iVar6);
  }
  if ((int)uVar8 < iVar4) {
    memset(pmVar1 + uVar9,0,(ulong)(iVar4 + ~uVar8) * 8 + 8);
  }
  b->sign = a->sign;
  if (0 < (int)uVar8) {
    do {
      uVar8 = (uint)uVar9;
      if (pmVar1[(uVar9 & 0xffffffff) - 1] != 0) goto LAB_001044d5;
      b->used = uVar8 - 1;
      uVar9 = (ulong)(uVar8 - 1);
    } while (1 < (int)uVar8);
    uVar8 = 0;
  }
LAB_001044d5:
  if (uVar8 == 0) {
    b->sign = 0;
  }
  return 0;
}

Assistant:

int mp_div_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* copy */
  if (b->alloc < a->used) {
    if ((res = mp_grow (b, a->used)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;
  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* source alias */
    tmpa = a->dp + b->used - 1;

    /* dest alias */
    tmpb = b->dp + b->used - 1;

    /* carry */
    r = 0;
    for (x = b->used - 1; x >= 0; x--) {
      /* get the carry for the next iteration */
      rr = *tmpa & 1;

      /* shift the current digit, add in carry and store */
      *tmpb-- = (*tmpa-- >> 1) | (r << (DIGIT_BIT - 1));

      /* forward carry to next iteration */
      r = rr;
    }

    /* zero excess digits */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  mp_clamp (b);
  return MP_OKAY;
}